

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

shared_ptr<aeron::Publication> __thiscall
aeron::archive::AeronArchive::addRecordedPublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  undefined8 channel_00;
  bool bVar1;
  int32_t sessionId;
  element_type *peVar2;
  __shared_ptr *this_00;
  element_type *peVar3;
  ArchiveException *this_01;
  char *pcVar4;
  int32_t in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<aeron::Publication> sVar5;
  string local_148;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [32];
  int64_t pubId;
  undefined8 uStack_20;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *this_local;
  shared_ptr<aeron::Publication> *publication;
  
  uStack_20 = CONCAT44(in_register_00000014,streamId);
  pubId._4_4_ = in_ECX;
  channel_local = channel;
  this_local = this;
  peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&channel[9]._M_string_length);
  local_48._24_8_ = Aeron::addPublication(peVar2,(string *)uStack_20,pubId._4_4_);
  local_48[0x17] = 0;
  std::shared_ptr<aeron::Publication>::shared_ptr((shared_ptr<aeron::Publication> *)this);
  while( true ) {
    peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&channel[9]._M_string_length);
    Aeron::findPublication((Aeron *)local_48,(int64_t)peVar2);
    this_00 = (__shared_ptr *)
              std::shared_ptr<aeron::Publication>::operator=
                        ((shared_ptr<aeron::Publication> *)this,
                         (shared_ptr<aeron::Publication> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    std::shared_ptr<aeron::Publication>::~shared_ptr((shared_ptr<aeron::Publication> *)local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::this_thread::yield();
  }
  peVar3 = std::__shared_ptr_access<aeron::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = Publication::isOriginal(peVar3);
  channel_00 = uStack_20;
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<aeron::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<aeron::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    sessionId = Publication::sessionId(peVar3);
    ChannelUri::addSessionId(&local_148,(string *)channel_00,sessionId);
    startRecording((AeronArchive *)channel,&local_148,pubId._4_4_,LOCAL);
    std::__cxx11::string::~string((string *)&local_148);
    sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<aeron::Publication>)
           sVar5.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_122 = 1;
  this_01 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_b8,"publication already added for channel=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_20);
  std::operator+(&local_98,&local_b8,", stream id=");
  std::__cxx11::to_string(&local_d8,pubId._4_4_);
  std::operator+(&local_78,&local_98,&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,
             "std::shared_ptr<aeron::Publication> aeron::archive::AeronArchive::addRecordedPublication(const std::string &, std::int32_t)"
             ,&local_f9);
  pcVar4 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,pcVar4,&local_121);
  ArchiveException::ArchiveException(this_01,&local_78,&local_f8,&local_120,0x82);
  local_122 = 0;
  __cxa_throw(this_01,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

std::shared_ptr<aeron::Publication> AeronArchive::addRecordedPublication(const std::string& channel,
                                                                         std::int32_t streamId) {
    std::int64_t pubId = aeron_->addPublication(channel, streamId);
    std::shared_ptr<aeron::Publication> publication;
    while (!(publication = aeron_->findPublication(pubId))) {
        std::this_thread::yield();
    }

    if (!publication->isOriginal()) {
        throw ArchiveException(
            "publication already added for channel=" + channel + ", stream id=" + std::to_string(streamId), SOURCEINFO);
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}